

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

int * __thiscall google::protobuf::RepeatedField<int>::Mutable(RepeatedField<int> *this,int index)

{
  LogMessage *pLVar1;
  int *piVar2;
  LogMessage local_60;
  LogFinisher local_21;
  
  if (index < 0) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/repeated_field.h"
               ,0x525);
    pLVar1 = internal::LogMessage::operator<<(&local_60,"CHECK failed: (index) >= (0): ");
    internal::LogFinisher::operator=(&local_21,pLVar1);
    internal::LogMessage::~LogMessage(&local_60);
  }
  if (this->current_size_ <= index) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/repeated_field.h"
               ,0x526);
    pLVar1 = internal::LogMessage::operator<<(&local_60,"CHECK failed: (index) < (current_size_): ")
    ;
    internal::LogFinisher::operator=(&local_21,pLVar1);
    internal::LogMessage::~LogMessage(&local_60);
  }
  piVar2 = elements(this);
  return piVar2 + index;
}

Assistant:

inline Element* RepeatedField<Element>::Mutable(int index) {
  GOOGLE_DCHECK_GE(index, 0);
  GOOGLE_DCHECK_LT(index, current_size_);
  return &elements()[index];
}